

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

lbool __thiscall Minisat::SimpSolver::solve_(SimpSolver *this,bool do_simp,bool turn_off_simp)

{
  int iVar1;
  bool bVar2;
  Size SVar3;
  Lit *pLVar4;
  char *pcVar5;
  int *piVar6;
  Size local_54;
  lbool local_4d;
  int i_1;
  int local_48 [2];
  Var v;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vec<int,_int> extra_frozen;
  bool turn_off_simp_local;
  bool do_simp_local;
  SimpSolver *this_local;
  lbool result;
  
  extra_frozen.cap._2_1_ = turn_off_simp;
  extra_frozen.cap._3_1_ = do_simp;
  vec<int,_int>::vec((vec<int,_int> *)local_30);
  this_local._7_1_ = l_True.value;
  extra_frozen.cap._3_1_ = (extra_frozen.cap._3_1_ & 1 & this->use_simplification & 1U) != 0;
  if ((bool)extra_frozen.cap._3_1_) {
    for (local_34 = 0; iVar1 = local_34,
        SVar3 = vec<Minisat::Lit,_int>::size(&(this->super_Solver).assumptions), iVar1 < SVar3;
        local_34 = local_34 + 1) {
      pLVar4 = vec<Minisat::Lit,_int>::operator[](&(this->super_Solver).assumptions,local_34);
      i_1 = pLVar4->x;
      local_48[0] = var((Lit)i_1);
      bVar2 = isEliminated(this,local_48[0]);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!isEliminated(v)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                      ,0x77,"lbool Minisat::SimpSolver::solve_(bool, bool)");
      }
      pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          local_48[0]);
      if (*pcVar5 == '\0') {
        setFrozen(this,local_48[0],true);
        vec<int,_int>::push((vec<int,_int> *)local_30,local_48);
      }
    }
    bVar2 = eliminate(this,(bool)(extra_frozen.cap._2_1_ & 1));
    lbool::lbool(&local_4d,bVar2);
    this_local._7_1_ = local_4d.value;
  }
  bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),l_True);
  if (bVar2) {
    this_local._7_1_ = Solver::solve_(&this->super_Solver);
  }
  else if (0 < (this->super_Solver).verbosity) {
    printf("===============================================================================\n");
  }
  bVar2 = lbool::operator==((lbool *)((long)&this_local + 7),l_True);
  if ((bVar2) && ((this->extend_model & 1U) != 0)) {
    extendModel(this);
  }
  if ((extra_frozen.cap._3_1_ & 1) != 0) {
    for (local_54 = 0; SVar3 = vec<int,_int>::size((vec<int,_int> *)local_30), local_54 < SVar3;
        local_54 = local_54 + 1) {
      piVar6 = vec<int,_int>::operator[]((vec<int,_int> *)local_30,local_54);
      setFrozen(this,*piVar6,false);
    }
  }
  vec<int,_int>::~vec((vec<int,_int> *)local_30);
  return (lbool)this_local._7_1_;
}

Assistant:

lbool SimpSolver::solve_(bool do_simp, bool turn_off_simp)
{
    vec<Var> extra_frozen;
    lbool    result = l_True;

    do_simp &= use_simplification;

    if (do_simp){
        // Assumptions must be temporarily frozen to run variable elimination:
        for (int i = 0; i < assumptions.size(); i++){
            Var v = var(assumptions[i]);

            // If an assumption has been eliminated, remember it.
            assert(!isEliminated(v));

            if (!frozen[v]){
                // Freeze and store.
                setFrozen(v, true);
                extra_frozen.push(v);
            } }

        result = lbool(eliminate(turn_off_simp));
    }

    if (result == l_True)
        result = Solver::solve_();
    else if (verbosity >= 1)
        printf("===============================================================================\n");

    if (result == l_True && extend_model)
        extendModel();

    if (do_simp)
        // Unfreeze the assumptions that were frozen:
        for (int i = 0; i < extra_frozen.size(); i++)
            setFrozen(extra_frozen[i], false);

    return result;
}